

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O0

Resource res_getTableItemByKey_63(ResourceData *pResData,Resource table,int32_t *indexR,char **key)

{
  ushort uVar1;
  int length_00;
  uint uVar2;
  uint uVar3;
  int32_t iVar4;
  Resource RVar5;
  ushort *puVar6;
  int *piVar7;
  int32_t *p_2;
  uint16_t *p_1;
  Resource *p32;
  uint16_t *p;
  int32_t idx;
  int32_t length;
  uint32_t offset;
  char **key_local;
  int32_t *indexR_local;
  Resource table_local;
  ResourceData *pResData_local;
  
  uVar2 = table & 0xfffffff;
  if ((key != (char **)0x0) && (*key != (char *)0x0)) {
    uVar3 = table >> 0x1c;
    if (uVar3 == 2) {
      if (uVar2 != 0) {
        puVar6 = (ushort *)(pResData->pRoot + uVar2);
        uVar2 = (uint)*puVar6;
        iVar4 = _res_findTableItem(pResData,puVar6 + 1,uVar2,*key,key);
        *indexR = iVar4;
        if (-1 < iVar4) {
          return *(Resource *)
                  (puVar6 + 1 +
                  (long)(int)uVar2 + (long)(int)((uVar2 ^ 0xffffffff) & 1) + (long)iVar4 * 2);
        }
      }
    }
    else if (uVar3 == 4) {
      if (uVar2 != 0) {
        piVar7 = pResData->pRoot + uVar2;
        length_00 = *piVar7;
        iVar4 = _res_findTable32Item(pResData,piVar7 + 1,length_00,*key,key);
        *indexR = iVar4;
        if (-1 < iVar4) {
          return (piVar7 + 1)[length_00 + iVar4];
        }
      }
    }
    else if (uVar3 == 5) {
      puVar6 = pResData->p16BitUnits + uVar2;
      uVar1 = *puVar6;
      iVar4 = _res_findTableItem(pResData,puVar6 + 1,(uint)uVar1,*key,key);
      *indexR = iVar4;
      if (-1 < iVar4) {
        RVar5 = makeResourceFrom16(pResData,(uint)(puVar6 + 1)[(int)((uint)uVar1 + iVar4)]);
        return RVar5;
      }
    }
  }
  return 0xffffffff;
}

Assistant:

U_CAPI Resource U_EXPORT2
res_getTableItemByKey(const ResourceData *pResData, Resource table,
                      int32_t *indexR, const char **key) {
    uint32_t offset=RES_GET_OFFSET(table);
    int32_t length;
    int32_t idx;
    if(key == NULL || *key == NULL) {
        return RES_BOGUS;
    }
    switch(RES_GET_TYPE(table)) {
    case URES_TABLE: {
        if (offset!=0) { /* empty if offset==0 */
            const uint16_t *p= (const uint16_t *)(pResData->pRoot+offset);
            length=*p++;
            *indexR=idx=_res_findTableItem(pResData, p, length, *key, key);
            if(idx>=0) {
                const Resource *p32=(const Resource *)(p+length+(~length&1));
                return p32[idx];
            }
        }
        break;
    }
    case URES_TABLE16: {
        const uint16_t *p=pResData->p16BitUnits+offset;
        length=*p++;
        *indexR=idx=_res_findTableItem(pResData, p, length, *key, key);
        if(idx>=0) {
            return makeResourceFrom16(pResData, p[length+idx]);
        }
        break;
    }
    case URES_TABLE32: {
        if (offset!=0) { /* empty if offset==0 */
            const int32_t *p= pResData->pRoot+offset;
            length=*p++;
            *indexR=idx=_res_findTable32Item(pResData, p, length, *key, key);
            if(idx>=0) {
                return (Resource)p[length+idx];
            }
        }
        break;
    }
    default:
        break;
    }
    return RES_BOGUS;
}